

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode * __thiscall JSONNode::operator[](JSONNode *this,json_index_t pos)

{
  internalJSONNode *piVar1;
  json_index_t jVar2;
  JSONNode *pJVar3;
  allocator local_41;
  json_string local_40;
  
  piVar1 = this->internal;
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  jVar2 = internalJSONNode::size(this->internal);
  std::__cxx11::string::string((string *)&local_40,"[] const out of bounds",&local_41);
  JSONDebug::_JSON_ASSERT(pos < jVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pJVar3 = internalJSONNode::at(this->internal,pos);
  return pJVar3;
}

Assistant:

const JSONNode & JSONNode::operator[](json_index_t pos) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(pos < internal -> size(), JSON_TEXT("[] const out of bounds"));
    return *(internal -> at(pos));
}